

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  byte bVar8;
  ushort uVar9;
  byte *pbVar10;
  VP8Encoder *pVVar11;
  DError *paaiVar12;
  bool bVar13;
  ushort uVar14;
  int iVar15;
  uint32_t uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint16_t *puVar23;
  int8_t *piVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int16_t (*paiVar28) [16];
  ushort uVar29;
  int iVar30;
  uint8_t *puVar31;
  undefined8 *puVar32;
  uint8_t *puVar33;
  uint16_t *puVar34;
  long lVar35;
  ushort uVar36;
  uint8_t *puVar37;
  ulong uVar38;
  undefined1 *puVar39;
  uint8_t *puVar40;
  long lVar41;
  uint8_t *puVar42;
  ulong uVar43;
  char cVar44;
  VP8ModeScore *rd_00;
  VP8ModeScore *pVVar45;
  uint8_t *puVar46;
  uint8_t *puVar47;
  score_t sVar48;
  VP8ModeScore *__src;
  long lVar49;
  long lVar50;
  bool bVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint32_t v;
  int local_4a0;
  uint local_48c;
  long local_460;
  undefined1 local_458 [16];
  long local_440;
  long local_438;
  long lStack_430;
  long local_428;
  ulong local_420;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  long local_388;
  undefined8 local_360 [64];
  undefined1 local_160 [2];
  short local_15e [139];
  uint local_48;
  int8_t local_44 [3];
  int8_t local_40 [16];
  
  iVar19 = it->enc->method;
  rd->nz = 0;
  rd->D = 0;
  rd->SD = 0;
  rd->H = 0;
  rd->R = 0;
  rd->score = 0x7fffffffffffff;
  if (it->x == 0) {
    puVar37 = (uint8_t *)0x0;
  }
  else {
    puVar37 = it->y_left;
  }
  if (it->y == 0) {
    puVar31 = (uint8_t *)0x0;
  }
  else {
    puVar31 = it->y_top;
  }
  (*VP8EncPredLuma16)(it->yuv_p,puVar37,puVar31);
  if (it->x == 0) {
    puVar37 = (uint8_t *)0x0;
  }
  else {
    puVar37 = it->u_left;
  }
  if (it->y == 0) {
    puVar31 = (uint8_t *)0x0;
  }
  else {
    puVar31 = it->uv_top;
  }
  (*VP8EncPredChroma8)(it->yuv_p,puVar37,puVar31);
  local_428 = 0x7fffffffffffff;
  if (rd_opt == RD_OPT_NONE) {
    bVar51 = true;
    bVar52 = 1 < iVar19;
    if (iVar19 < 2) {
      bVar51 = ((uint)*it->mb & 3) == 1;
    }
    lVar21 = 0x7fffffffffffff;
    if (1 < iVar19) {
      lVar21 = (long)it->enc->mb_header_limit;
    }
    sVar48 = it->enc->dqm[*(byte *)it->mb >> 5 & 3].i4_penalty;
    if (bVar51) {
      pbVar10 = it->yuv_in;
      puVar37 = it->yuv_p;
      iVar27 = -1;
      puVar23 = VP8I16ModeOffsets;
      lVar50 = 0;
      lVar22 = 0x7fffffffffffff;
      do {
        iVar18 = (*VP8SSE16x16)(pbVar10,puVar37 + *puVar23);
        local_460 = (ulong)VP8FixedCostsI16[lVar50] * 0x6a + (long)iVar18 * 0x100;
        iVar18 = (int)lVar50;
        if (lVar22 <= local_460) {
          local_460 = lVar22;
          iVar18 = iVar27;
        }
        if (lVar50 != 0 && lVar21 < (long)(ulong)VP8FixedCostsI16[lVar50]) {
          local_460 = lVar22;
          iVar18 = iVar27;
        }
        iVar27 = iVar18;
        lVar50 = lVar50 + 1;
        puVar23 = puVar23 + 1;
        lVar22 = local_460;
      } while (lVar50 != 4);
      if ((it->x == 0) || (it->y == 0)) {
        iVar18 = (uint)*pbVar10 * 0x1010101;
        local_3a8._0_4_ = iVar18;
        lVar22 = 0;
        do {
          bVar13 = true;
          if ((((*(int *)(pbVar10 + lVar22) != iVar18) || (*(int *)(pbVar10 + lVar22 + 4) != iVar18)
               ) || (*(int *)(pbVar10 + lVar22 + 8) != iVar18)) ||
             (*(int *)(pbVar10 + lVar22 + 0xc) != iVar18)) goto LAB_001371c1;
          lVar22 = lVar22 + 0x20;
        } while ((int)lVar22 != 0x200);
        bVar13 = false;
LAB_001371c1:
        if (!bVar13) {
          bVar52 = false;
          iVar27 = (uint)(it->x != 0) * 2;
        }
      }
      VP8SetIntra16Mode(it,iVar27);
    }
    else {
      local_460 = 0x7fffffffffffff;
    }
    if ((bVar52) || (!bVar51)) {
      VP8IteratorStartI4(it);
      local_440 = 0;
      bVar51 = false;
      uVar25 = 0;
      do {
        uVar14 = VP8Scan[it->i4];
        puVar37 = it->yuv_in;
        puVar23 = GetCostModeI4(it,rd->modes_i4);
        (*VP8EncPredLuma4)(it->yuv_p,it->i4_top);
        uVar43 = 0xffffffff;
        puVar34 = VP8I4ModeOffsets;
        uVar38 = 0;
        lVar22 = 0x7fffffffffffff;
        do {
          iVar27 = (*VP8SSE4x4)(puVar37 + uVar14,it->yuv_p + *puVar34);
          lVar50 = (ulong)puVar23[uVar38] * 0xb + (long)iVar27 * 0x100;
          if (lVar50 < lVar22) {
            uVar43 = uVar38 & 0xffffffff;
          }
          if (lVar22 < lVar50) {
            lVar50 = lVar22;
          }
          uVar38 = uVar38 + 1;
          puVar34 = puVar34 + 1;
          lVar22 = lVar50;
        } while (uVar38 != 10);
        local_440 = local_440 + (ulong)puVar23[(int)uVar43];
        iVar27 = it->i4;
        rd->modes_i4[iVar27] = (uint8_t)uVar43;
        sVar48 = sVar48 + lVar50;
        if (lVar21 < local_440 || local_460 <= sVar48) {
          bVar51 = true;
          break;
        }
        iVar27 = ReconstructIntra4(it,rd->y_ac_levels[iVar27],puVar37 + uVar14,
                                   it->yuv_out2 + VP8Scan[iVar27],(int)uVar43);
        uVar25 = uVar25 | iVar27 << ((byte)it->i4 & 0x1f);
        iVar27 = VP8IteratorRotateI4(it,it->yuv_out2);
      } while (iVar27 != 0);
    }
    else {
      uVar25 = 0;
    }
    if (bVar51) {
      uVar25 = ReconstructIntra16(it,rd,it->yuv_out,(uint)*it->preds);
      sVar48 = local_460;
    }
    else {
      VP8SetIntra4Mode(it,rd->modes_i4);
      uVar3 = it->yuv_out;
      uVar6 = it->yuv_out2;
      auVar55._8_4_ = (int)uVar3;
      auVar55._0_8_ = uVar6;
      auVar55._12_4_ = (int)((ulong)uVar3 >> 0x20);
      it->yuv_out = (uint8_t *)uVar6;
      it->yuv_out2 = (uint8_t *)auVar55._8_8_;
    }
    if (0 < iVar19) {
      puVar37 = it->yuv_in;
      uVar38 = 0xffffffff;
      puVar23 = VP8UVModeOffsets;
      uVar43 = 0;
      lVar21 = 0x7fffffffffffff;
      do {
        iVar19 = (*VP8SSE16x8)(puVar37 + 0x10,it->yuv_p + *puVar23);
        lVar22 = (ulong)VP8FixedCostsUV[uVar43] * 0x78 + (long)iVar19 * 0x100;
        if (lVar22 < lVar21) {
          uVar38 = uVar43 & 0xffffffff;
        }
        if (lVar22 <= lVar21) {
          lVar21 = lVar22;
        }
        uVar43 = uVar43 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar43 != 4);
      VP8SetIntraUVMode(it,(int)uVar38);
    }
    uVar20 = ReconstructUV(it,rd,it->yuv_out + 0x10,(uint)*it->mb >> 2 & 3);
    rd->nz = uVar20 | uVar25;
    rd->score = sVar48;
  }
  else {
    it->do_trellis = (uint)(RD_OPT_TRELLIS < rd_opt);
    pbVar10 = it->yuv_in;
    pVVar11 = it->enc;
    uVar25 = *(byte *)it->mb >> 5 & 3;
    iVar27 = pVVar11->dqm[uVar25].lambda_i16;
    iVar18 = pVVar11->dqm[uVar25].tlambda;
    iVar15 = (uint)*pbVar10 * 0x1010101;
    local_3a8._0_4_ = iVar15;
    bVar52 = false;
    lVar21 = 0;
    do {
      bVar51 = bVar52;
      if (((*(int *)(pbVar10 + lVar21) != iVar15) || (*(int *)(pbVar10 + lVar21 + 4) != iVar15)) ||
         ((*(int *)(pbVar10 + lVar21 + 8) != iVar15 ||
          (bVar51 = false, *(int *)(pbVar10 + lVar21 + 0xc) != iVar15)))) goto LAB_00136471;
      lVar21 = lVar21 + 0x20;
    } while ((int)lVar21 != 0x200);
    bVar51 = true;
LAB_00136471:
    rd->mode_i16 = -1;
    lVar21 = 0;
    rd_00 = (VP8ModeScore *)local_3a8;
    __src = rd;
    do {
      puVar37 = it->yuv_out2;
      rd_00->mode_i16 = (int)lVar21;
      uVar16 = ReconstructIntra16(it,rd_00,puVar37,(int)lVar21);
      rd_00->nz = uVar16;
      iVar15 = (*VP8SSE16x16)(pbVar10,puVar37);
      rd_00->D = (long)iVar15;
      if (iVar18 == 0) {
        lVar22 = 0;
      }
      else {
        iVar15 = (*VP8TDisto16x16)(pbVar10,puVar37,kWeightY);
        lVar22 = (long)(iVar15 * iVar18 + 0x80 >> 8);
      }
      rd_00->SD = lVar22;
      rd_00->H = (ulong)VP8FixedCostsI16[lVar21];
      iVar15 = VP8GetCostLuma16(it,rd_00);
      rd_00->R = (long)iVar15;
      if (bVar51) {
        paiVar28 = rd_00->y_ac_levels;
        iVar30 = 0;
        iVar17 = 0x10;
        do {
          iVar26 = iVar17;
          if (iVar26 == 0) {
            bVar51 = true;
            break;
          }
          bVar51 = false;
          uVar20 = (uint)((*paiVar28)[1] != 0);
          bVar52 = SCARRY4(iVar30,uVar20);
          iVar30 = iVar30 + uVar20;
          if (iVar30 == 0 || bVar52 != iVar30 < 0) {
            uVar43 = 0;
            do {
              if (uVar43 == 0xe) {
                paiVar28 = paiVar28 + 1;
                bVar52 = true;
                goto LAB_00136587;
              }
              lVar22 = uVar43 + 2;
              uVar43 = uVar43 + 1;
              uVar20 = (uint)((*paiVar28)[lVar22] != 0);
              bVar52 = SCARRY4(iVar30,uVar20);
              iVar30 = iVar30 + uVar20;
            } while (iVar30 == 0 || bVar52 != iVar30 < 0);
            bVar52 = 0xe < uVar43;
          }
          else {
            bVar52 = false;
          }
LAB_00136587:
          iVar17 = iVar26 + -1;
        } while (bVar52);
        if (iVar26 == 0) {
          rd_00->D = rd_00->D * 2;
          rd_00->SD = rd_00->SD * 2;
        }
        else {
          bVar51 = false;
        }
      }
      else {
        bVar51 = false;
      }
      lVar22 = (rd_00->SD + rd_00->D) * 0x100 + ((long)iVar15 + rd_00->H) * (long)iVar27;
      rd_00->score = lVar22;
      if ((lVar21 == 0) || (pVVar45 = rd_00, lVar22 < __src->score)) {
        uVar1 = it->yuv_out;
        uVar4 = it->yuv_out2;
        auVar53._8_4_ = (int)uVar1;
        auVar53._0_8_ = uVar4;
        auVar53._12_4_ = (int)((ulong)uVar1 >> 0x20);
        it->yuv_out = (uint8_t *)uVar4;
        it->yuv_out2 = (uint8_t *)auVar53._8_8_;
        pVVar45 = __src;
        __src = rd_00;
      }
      lVar21 = lVar21 + 1;
      rd_00 = pVVar45;
    } while (lVar21 != 4);
    if (__src != rd) {
      memcpy(rd,__src,0x370);
    }
    rd->score = (rd->SD + rd->D) * 0x100 + (rd->H + rd->R) * (long)pVVar11->dqm[uVar25].lambda_mode;
    VP8SetIntra16Mode(it,rd->mode_i16);
    if (((rd->nz & 0x100ffff) == 0x1000000) && ((long)pVVar11->dqm[uVar25].min_disto < rd->D)) {
      uVar14 = rd->y_dc_levels[1];
      uVar9 = rd->y_dc_levels[2];
      uVar29 = -uVar14;
      if (0 < (short)uVar14) {
        uVar29 = uVar14;
      }
      uVar14 = -uVar9;
      if (0 < (short)uVar9) {
        uVar14 = uVar9;
      }
      uVar9 = rd->y_dc_levels[4];
      uVar36 = -uVar9;
      if (0 < (short)uVar9) {
        uVar36 = uVar9;
      }
      if (uVar29 < uVar14) {
        uVar29 = uVar14;
      }
      if (uVar36 <= uVar29) {
        uVar36 = uVar29;
      }
      if (pVVar11->dqm[uVar25].max_edge < (int)(uint)uVar36) {
        pVVar11->dqm[uVar25].max_edge = (uint)uVar36;
      }
    }
    if ((1 < iVar19) && (pVVar11 = it->enc, pVVar11->max_i4_header_bits != 0)) {
      uVar25 = *(byte *)it->mb >> 5 & 3;
      lVar21 = (long)pVVar11->dqm[uVar25].lambda_i4;
      iVar19 = pVVar11->dqm[uVar25].tlambda;
      puVar31 = it->yuv_in;
      local_48 = 0;
      local_3a8 = (undefined1  [16])0x0;
      local_398 = ZEXT816(0xd3);
      local_388 = (long)pVVar11->dqm[uVar25].lambda_mode * 0xd3;
      puVar47 = it->yuv_out2;
      VP8IteratorStartI4(it);
      puVar37 = rd->modes_i4;
      iVar27 = 0;
      do {
        uVar14 = VP8Scan[it->i4];
        puVar33 = puVar31 + uVar14;
        puVar23 = GetCostModeI4(it,puVar37);
        puVar46 = it->yuv_p + 0x688;
        (*VP8EncPredLuma4)(it->yuv_p,it->i4_top);
        local_4a0 = -1;
        lVar50 = 0;
        local_3e8 = 0;
        local_3e0 = 0;
        local_420 = 0;
        local_48c = 0;
        lVar22 = 0x7fffffffffffff;
        local_3f0 = 0;
        puVar40 = puVar47 + uVar14;
        do {
          iVar15 = ReconstructIntra4(it,(int16_t *)&local_3c8,puVar33,puVar46,(int)lVar50);
          iVar18 = it->i4;
          iVar17 = (*VP8SSE4x4)(puVar33,puVar46);
          if (iVar19 == 0) {
            lVar41 = 0;
          }
          else {
            iVar30 = (*VP8TDisto4x4)(puVar33,puVar46,kWeightY);
            lVar41 = (long)(iVar30 * iVar19 + 0x80 >> 8);
          }
          uVar43 = (ulong)puVar23[lVar50];
          if (lVar50 != 0) {
            iVar30 = 0;
            iVar26 = 1;
            puVar32 = &local_3c8;
            do {
              bVar52 = iVar26 == 0;
              iVar26 = iVar26 + -1;
              if (bVar52) {
                lVar49 = 0x8c;
                goto LAB_00136933;
              }
              iVar30 = (iVar30 + 1) - (uint)(*(short *)((long)puVar32 + 2) == 0);
              if (iVar30 < 4) {
                uVar38 = 0;
                do {
                  if (uVar38 == 0xe) {
                    puVar32 = puVar32 + 4;
                    bVar52 = true;
                    goto LAB_00136923;
                  }
                  iVar30 = (iVar30 + 1) - (uint)(*(short *)((long)puVar32 + uVar38 * 2 + 4) == 0);
                  uVar38 = uVar38 + 1;
                } while (iVar30 < 4);
                bVar52 = 0xe < uVar38;
              }
              else {
                bVar52 = false;
              }
LAB_00136923:
            } while (bVar52);
          }
          lVar49 = 0;
LAB_00136933:
          lVar35 = (lVar41 + iVar17) * 0x100;
          puVar42 = puVar40;
          if ((local_4a0 < 0) || ((long)((lVar49 + uVar43) * lVar21 + lVar35) < lVar22)) {
            iVar30 = VP8GetCostLuma4(it,(int16_t *)&local_3c8);
            lVar35 = (lVar49 + iVar30 + uVar43) * lVar21 + lVar35;
            if ((local_4a0 < 0) || (lVar35 < lVar22)) {
              lVar22 = (long)it->i4;
              local_360[lVar22 * 4 + 2] = local_3b8;
              local_360[lVar22 * 4 + 3] = uStack_3b0;
              local_360[lVar22 * 4] = local_3c8;
              local_360[lVar22 * 4 + 1] = uStack_3c0;
              lVar22 = lVar35;
              puVar42 = puVar46;
              puVar46 = puVar40;
              local_48c = iVar15 << ((byte)iVar18 & 0x1f);
              local_420 = uVar43;
              local_3f0 = lVar49 + iVar30;
              local_3e8 = (long)iVar17;
              local_3e0 = lVar41;
              local_4a0 = (int)lVar50;
            }
          }
          lVar50 = lVar50 + 1;
          puVar40 = puVar42;
        } while (lVar50 != 10);
        local_3a8._8_8_ = local_3a8._8_8_ + local_3e0;
        local_3a8._0_8_ = local_3a8._0_8_ + local_3e8;
        local_398._8_8_ = local_398._8_8_ + local_3f0;
        local_398._0_8_ = local_398._0_8_ + local_420;
        local_48 = local_48 | local_48c;
        local_388 = (local_3e8 + local_3e0) * 0x100 +
                    (local_420 + local_3f0) * (long)pVVar11->dqm[uVar25].lambda_mode + local_388;
        if (local_388 < rd->score) {
          iVar27 = iVar27 + (int)local_420;
          if (pVVar11->max_i4_header_bits < iVar27) {
            bVar52 = false;
          }
          else {
            if (puVar42 != puVar47 + VP8Scan[it->i4]) {
              (*VP8Copy4x4)(puVar42,puVar47 + VP8Scan[it->i4]);
            }
            iVar18 = it->i4;
            puVar37[iVar18] = (uint8_t)local_4a0;
            it->left_nz[iVar18 >> 2] = (uint)(local_48c != 0);
            it->top_nz[it->i4 & 3] = (uint)(local_48c != 0);
            bVar52 = true;
          }
        }
        else {
          bVar52 = false;
        }
        if (!bVar52) goto LAB_00136be2;
        iVar18 = VP8IteratorRotateI4(it,puVar47);
      } while (iVar18 != 0);
      rd->D = local_3a8._0_8_;
      rd->SD = local_3a8._8_8_;
      rd->H = local_398._0_8_;
      rd->R = local_398._8_8_;
      rd->nz = local_48;
      rd->score = local_388;
      VP8SetIntra4Mode(it,puVar37);
      uVar2 = it->yuv_out;
      uVar5 = it->yuv_out2;
      auVar54._8_4_ = (int)uVar2;
      auVar54._0_8_ = uVar5;
      auVar54._12_4_ = (int)((ulong)uVar2 >> 0x20);
      it->yuv_out = (uint8_t *)uVar5;
      it->yuv_out2 = (uint8_t *)auVar54._8_8_;
      memcpy(rd->y_ac_levels,local_360,0x200);
    }
LAB_00136be2:
    iVar19 = it->enc->dqm[*(byte *)it->mb >> 5 & 3].lambda_uv;
    puVar37 = it->yuv_in;
    puVar31 = it->yuv_out2;
    puVar46 = it->yuv_out + 0x10;
    rd->mode_uv = -1;
    local_458 = (undefined1  [16])0x0;
    lVar21 = 0;
    uVar25 = 0;
    local_438 = 0;
    lStack_430 = 0;
    puVar31 = puVar31 + 0x10;
    puVar47 = puVar46;
    do {
      local_48 = ReconstructUV(it,(VP8ModeScore *)local_3a8,puVar31,(int)lVar21);
      iVar27 = (*VP8SSE16x8)(puVar37 + 0x10,puVar31);
      auVar55 = local_398;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = (long)iVar27;
      local_398._2_6_ = 0;
      local_398._0_2_ = VP8FixedCostsUV[lVar21];
      local_398._8_8_ = auVar55._8_8_;
      iVar27 = VP8GetCostUV(it,(VP8ModeScore *)local_3a8);
      uVar20 = local_48;
      local_398._8_8_ = (long)iVar27;
      if (lVar21 != 0) {
        iVar18 = 0;
        iVar15 = 8;
        puVar39 = local_160;
        do {
          bVar52 = iVar15 == 0;
          iVar15 = iVar15 + -1;
          if (bVar52) {
            local_398._8_8_ = (long)iVar27 + 0x460;
            break;
          }
          iVar18 = (iVar18 + 1) - (uint)(*(short *)(puVar39 + 2) == 0);
          if (iVar18 < 3) {
            uVar43 = 0;
            do {
              if (uVar43 == 0xe) {
                puVar39 = puVar39 + 0x20;
                bVar52 = true;
                goto LAB_00136d4c;
              }
              iVar18 = (iVar18 + 1) - (uint)(*(short *)(puVar39 + uVar43 * 2 + 4) == 0);
              uVar43 = uVar43 + 1;
            } while (iVar18 < 3);
            bVar52 = 0xe < uVar43;
          }
          else {
            bVar52 = false;
          }
LAB_00136d4c:
        } while (bVar52);
      }
      lVar22 = (local_3a8._8_8_ + local_3a8._0_8_) * 0x100 +
               (local_398._8_8_ + local_398._0_8_) * (long)iVar19;
      local_388 = lVar22;
      if ((lVar21 == 0) || (puVar33 = puVar31, lVar22 < local_428)) {
        local_458 = local_3a8;
        local_438 = local_398._0_8_;
        lStack_430 = local_398._8_8_;
        rd->mode_uv = (int)lVar21;
        memcpy(rd->uv_levels,local_160,0x100);
        puVar33 = puVar47;
        puVar47 = puVar31;
        local_428 = lVar22;
        uVar25 = uVar20;
        if (it->top_derr != (DError *)0x0) {
          *(undefined2 *)(rd->derr[1] + 1) = local_40._0_2_;
          *(undefined4 *)rd->derr = _local_44;
        }
      }
      lVar21 = lVar21 + 1;
      puVar31 = puVar33;
    } while (lVar21 != 4);
    VP8SetIntraUVMode(it,rd->mode_uv);
    rd->D = rd->D + local_458._0_8_;
    rd->SD = rd->SD + local_458._8_8_;
    rd->H = rd->H + local_438;
    rd->R = rd->R + lStack_430;
    rd->nz = rd->nz | uVar25;
    rd->score = rd->score + local_428;
    if (puVar47 != puVar46) {
      (*VP8Copy16x8)(puVar47,puVar46);
    }
    if (it->top_derr != (DError *)0x0) {
      iVar19 = it->x;
      piVar24 = rd->derr[0] + 2;
      lVar21 = 0;
      do {
        paaiVar12 = it->top_derr;
        it->left_derr[lVar21][0] = (*(int8_t (*) [3])(piVar24 + -2))[0];
        cVar7 = *piVar24;
        cVar44 = (char)((uint)(cVar7 * 3) >> 2);
        it->left_derr[lVar21][1] = cVar44;
        paaiVar12[iVar19][lVar21][0] = piVar24[-1];
        paaiVar12[iVar19][lVar21][1] = cVar7 - cVar44;
        lVar21 = lVar21 + 1;
        piVar24 = piVar24 + 3;
      } while (lVar21 == 1);
    }
    if (rd_opt == RD_OPT_TRELLIS) {
      it->do_trellis = 1;
      if (((uint)*it->mb & 3) == 1) {
        uVar25 = ReconstructIntra16(it,rd,it->yuv_out,(uint)*it->preds);
      }
      else {
        pVVar11 = it->enc;
        VP8IteratorStartI4(it);
        uVar25 = 0;
        do {
          uVar20 = it->i4;
          uVar14 = VP8Scan[(int)uVar20];
          bVar8 = it->preds[(int)(((int)uVar20 >> 2) * pVVar11->preds_w + (uVar20 & 3))];
          puVar37 = it->yuv_in;
          puVar31 = it->yuv_out;
          (*VP8EncPredLuma4)(it->yuv_p,it->i4_top);
          iVar19 = ReconstructIntra4(it,rd->y_ac_levels[it->i4],puVar37 + uVar14,puVar31 + uVar14,
                                     (uint)bVar8);
          uVar25 = uVar25 | iVar19 << ((byte)it->i4 & 0x1f);
          iVar19 = VP8IteratorRotateI4(it,it->yuv_out);
        } while (iVar19 != 0);
      }
      uVar20 = ReconstructUV(it,rd,it->yuv_out + 0x10,(uint)*it->mb >> 2 & 3);
      rd->nz = uVar20 | uVar25;
    }
  }
  uVar25 = (uint)(rd->nz == 0);
  VP8SetSkip(it,uVar25);
  return uVar25;
}

Assistant:

int VP8Decimate(VP8EncIterator* WEBP_RESTRICT const it,
                VP8ModeScore* WEBP_RESTRICT const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc->method;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}